

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_tec_para_shard(REF_GRID ref_grid,char *root_filename)

{
  uint uVar1;
  char filename [1024];
  char acStack_408 [1024];
  
  uVar1 = ref_grid->mpi->n;
  if ((int)uVar1 < 2) {
    snprintf(acStack_408,0x400,"%s.tec",root_filename);
  }
  else {
    snprintf(acStack_408,0x400,"%s_%04d_%04d.tec",root_filename,(ulong)uVar1,
             (ulong)(uint)ref_grid->mpi->id);
  }
  uVar1 = ref_geom_tec(ref_grid,acStack_408);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe54,
           "ref_geom_tec_para_shard",(ulong)uVar1,"tec");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tec_para_shard(REF_GRID ref_grid,
                                           const char *root_filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  char filename[1024];
  if (ref_mpi_para(ref_mpi)) {
    snprintf(filename, 1024, "%s_%04d_%04d.tec", root_filename,
             ref_mpi_n(ref_mpi), ref_mpi_rank(ref_mpi));
  } else {
    snprintf(filename, 1024, "%s.tec", root_filename);
  }
  RSS(ref_geom_tec(ref_grid, filename), "tec");
  return REF_SUCCESS;
}